

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O2

void __thiscall depspawn::internal::TaskPool::~TaskPool(TaskPool *this)

{
  wait(this,(void *)0x0);
  std::_Function_base::~_Function_base(&(this->idle_func_).super__Function_base);
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::~LinkedListPool
            (&this->task_pool_);
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::~queue(&this->hp_queue_);
  boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  ::~queue(&this->queue_);
  ThreadPool::~ThreadPool(&this->thread_pool_);
  return;
}

Assistant:

~TaskPool()
  {
    wait(false);
  }